

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

int __thiscall
gl3cts::TransformFeedbackOverflowQueryFunctionalBase::init
          (TransformFeedbackOverflowQueryFunctionalBase *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  int extraout_EAX;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ulong uVar6;
  GLuint *pGVar7;
  ShaderProgram *this_00;
  char *pcVar8;
  TestError *this_01;
  NotSupportedError *this_02;
  allocator<char> local_161;
  string local_160;
  undefined1 local_13a;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_115 [13];
  string local_108;
  ProgramSources local_e8;
  long local_18;
  Functions *gl;
  TransformFeedbackOverflowQueryFunctionalBase *this_local;
  
  gl = (Functions *)this;
  TransformFeedbackOverflowQueryBaseTest::init
            (&this->super_TransformFeedbackOverflowQueryBaseTest,ctx);
  pRVar5 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)
  ;
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar3);
  bVar2 = canTestOverflow(this);
  if (!bVar2) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,
               "QUERY_COUNTER_BITS for TRANSFORM_FEEDBACK_OVERFLOW_ARB queries is zero, skipping test"
               ,&local_161);
    tcu::NotSupportedError::NotSupportedError(this_02,&local_160);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  (**(code **)(local_18 + 0x708))(1,&this->m_vao);
  (**(code **)(local_18 + 0xd8))(this->m_vao);
  (**(code **)(local_18 + 0x6e0))(1,&this->m_overflow_query);
  bVar2 = canTestStreamOverflow(this);
  if (bVar2) {
    GVar4 = TransformFeedbackOverflowQueryBaseTest::getMaxVertexStreams
                      (&this->super_TransformFeedbackOverflowQueryBaseTest);
    uVar6 = SUB168(ZEXT416(GVar4) * ZEXT816(4),0);
    if (SUB168(ZEXT416(GVar4) * ZEXT816(4),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pGVar7 = (GLuint *)operator_new__(uVar6);
    this->m_stream_overflow_query = pGVar7;
    pcVar1 = *(code **)(local_18 + 0x6e0);
    GVar4 = TransformFeedbackOverflowQueryBaseTest::getMaxVertexStreams
                      (&this->super_TransformFeedbackOverflowQueryBaseTest);
    (*pcVar1)(GVar4,this->m_stream_overflow_query);
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  local_13a = 1;
  pRVar5 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)
  ;
  pcVar8 = dummyVsh(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,pcVar8,local_115);
  pcVar8 = dummyFsh(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,pcVar8,&local_139);
  glu::makeVtxFragSources(&local_e8,&local_108,&local_138);
  glu::ShaderProgram::ShaderProgram(this_00,pRVar5,&local_e8);
  local_13a = 0;
  this->m_checker_program = this_00;
  glu::ProgramSources::~ProgramSources(&local_e8);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(local_115);
  bVar2 = glu::ShaderProgram::isOk(this->m_checker_program);
  if (bVar2) {
    buildTransformFeedbackProgram(this);
    setupTransformFeedbackBuffers(this);
    return extraout_EAX;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Checker program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
             ,0x3f6);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

virtual void init()
	{
		TransformFeedbackOverflowQueryBaseTest::init();

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		if (canTestOverflow())
		{
			// Setup vertex array
			gl.genVertexArrays(1, &m_vao);
			gl.bindVertexArray(m_vao);

			// Setup queries
			gl.genQueries(1, &m_overflow_query);

			if (canTestStreamOverflow())
			{
				m_stream_overflow_query = new GLuint[getMaxVertexStreams()];

				gl.genQueries(getMaxVertexStreams(), m_stream_overflow_query);
			}

			// Setup checker program
			m_checker_program =
				new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(dummyVsh(), dummyFsh()));
			if (!m_checker_program->isOk())
			{
				TCU_FAIL("Checker program compilation failed");
			}

			// Setup transform feedback shader and buffers
			buildTransformFeedbackProgram();
			setupTransformFeedbackBuffers();
		}
		else
		{
			throw tcu::NotSupportedError(
				"QUERY_COUNTER_BITS for TRANSFORM_FEEDBACK_OVERFLOW_ARB queries is zero, skipping test");
		}
	}